

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::PreLoadCMakeFiles(cmake *this)

{
  bool bVar1;
  string *psVar2;
  string pre_load;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string sStack_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = GetHomeDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)&sStack_48,(string *)psVar2);
  if (sStack_48._M_string_length != 0) {
    std::__cxx11::string::append((char *)&sStack_48);
    bVar1 = cmsys::SystemTools::FileExists(&sStack_48);
    if (bVar1) {
      ReadListFile(this,&local_28,&sStack_48);
    }
  }
  GetHomeOutputDirectory_abi_cxx11_(this);
  std::__cxx11::string::_M_assign((string *)&sStack_48);
  if (sStack_48._M_string_length != 0) {
    std::__cxx11::string::append((char *)&sStack_48);
    bVar1 = cmsys::SystemTools::FileExists(&sStack_48);
    if (bVar1) {
      ReadListFile(this,&local_28,&sStack_48);
    }
  }
  std::__cxx11::string::~string((string *)&sStack_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

void cmake::PreLoadCMakeFiles()
{
  std::vector<std::string> args;
  std::string pre_load = this->GetHomeDirectory();
  if (!pre_load.empty()) {
    pre_load += "/PreLoad.cmake";
    if (cmSystemTools::FileExists(pre_load)) {
      this->ReadListFile(args, pre_load);
    }
  }
  pre_load = this->GetHomeOutputDirectory();
  if (!pre_load.empty()) {
    pre_load += "/PreLoad.cmake";
    if (cmSystemTools::FileExists(pre_load)) {
      this->ReadListFile(args, pre_load);
    }
  }
}